

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sumhashgenerator.cpp
# Opt level: O1

char * __thiscall SumHashGenerator::hash(SumHashGenerator *this,char *src)

{
  uint uVar1;
  size_t sVar2;
  char *__s;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong unaff_RBX;
  
  sVar2 = strlen(src);
  if (0 < (int)(uint)sVar2) {
    uVar4 = 0;
    do {
      unaff_RBX = (ulong)(uint)((int)unaff_RBX + (int)src[uVar4]);
      uVar4 = uVar4 + 1;
    } while (((uint)sVar2 & 0x7fffffff) != uVar4);
  }
  uVar4 = unaff_RBX >> 0x1f & 1;
  uVar1 = (uint)uVar4;
  if ((int)unaff_RBX != 0) {
    uVar5 = unaff_RBX & 0xffffffff;
    do {
      uVar1 = (int)uVar4 + 1;
      uVar4 = (ulong)uVar1;
      iVar3 = (int)uVar5;
      uVar5 = (ulong)(uint)(iVar3 / 10);
    } while (0x12 < iVar3 + 9U);
  }
  __s = (char *)operator_new__((long)(int)(uVar1 + 1));
  memset(__s,0,(long)(int)(uVar1 + 1));
  sprintf(__s,"%d",unaff_RBX & 0xffffffff);
  return __s;
}

Assistant:

char* SumHashGenerator::hash(const char* src)
{
	int len = strlen(src);
	int sumlen = 0;
	int sum;

	for (int i = 0; i < len; ++i) {
		sum += (int)src[i];
	}

	sumlen = getNumberLength(sum);
	char* res = new char[sumlen + 1];
	memset(res, 0x00, sumlen + 1);

	sprintf(res, "%d", sum);

	return res;
}